

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentAggregateSystem.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::SilentAggregateSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SilentAggregateSystem *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Silent Aggregate System:\n");
  poVar1 = std::operator<<(poVar1,"Number Of Aggregates:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16NumAggregates);
  poVar1 = std::operator<<(poVar1,"\n");
  AggregateType::GetAsString_abi_cxx11_(&local_1c0,&this->m_AggTyp);
  std::operator<<(poVar1,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SilentAggregateSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Silent Aggregate System:\n"
       << "Number Of Aggregates:  " << m_ui16NumAggregates << "\n"
       << m_AggTyp.GetAsString();

    return ss.str();
}